

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::addTextToBuffer
          (DebugInfoRenderer *this,string *text,int yOffset)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  value_type_conflict5 local_70;
  value_type_conflict5 local_6e;
  value_type_conflict5 local_6c;
  value_type_conflict5 local_6a;
  value_type_conflict5 local_68;
  value_type_conflict5 local_66;
  undefined4 local_64;
  float local_60;
  int vtxNdx;
  float bx;
  float ax;
  int x;
  float by;
  float ay;
  int y;
  int fontXStart;
  int ndxInCharset;
  int ndxInText;
  allocator<char> local_29;
  undefined4 local_28;
  undefined4 local_24;
  int charHei;
  int charWid;
  int numCharacters;
  int yOffset_local;
  string *text_local;
  DebugInfoRenderer *this_local;
  
  charHei = 0xd;
  local_24 = 6;
  local_28 = 6;
  charWid = yOffset;
  _numCharacters = text;
  text_local = (string *)this;
  if (addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&addTextToBuffer(std::__cxx11::string_const&,int)::
                                 charsStr_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                 "0123456789.:/",&local_29);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_);
    }
  }
  fontXStart = 0;
  while( true ) {
    iVar2 = fontXStart;
    iVar3 = std::__cxx11::string::size();
    if (iVar3 <= iVar2) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)_numCharacters);
    y = std::__cxx11::string::find('\0',(ulong)(uint)(int)*pcVar4);
    ay = (float)(y * 6);
    for (by = 0.0; (int)by < 6; by = (float)((int)by + 1)) {
      x = (int)(((float)((int)by + charWid * 8) * 0.1) / 8.0 + -1.0);
      ax = ((float)((int)by + 1 + charWid * 8) * 0.1) / 8.0 + -1.0;
      for (bx = 0.0; (int)bx < 6; bx = (float)((int)bx + 1)) {
        vtxNdx = (int)(1.0 - ((float)((int)bx + fontXStart * 8) * 0.1) / 8.0);
        local_60 = 1.0 - ((float)((int)bx + 1 + fontXStart * 8) * 0.1) / 8.0;
        if (" ####    #   #### #####    #  ###### ########### ####  ####         ##       ##    #  ##  #    #     #  #   #     #         # #    ##    #        ##      # #    #   #      #   ###  #  #  #### # ###    #   ####  #####               #  #    #   #     #       #######     ###   #  #   #    #     #        ##    #   #    #   #    #   #    #    # #    ##    # #    #    #   ##   ##    ##   #     ####   ### ###### ####     #  ####  #### #      #### ###     ##        #     "
            [(int)by * 0x4e + (int)ay + (int)bx] != ' ') {
          sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_posBuf);
          lVar1 = (long)((ulong)(uint)((int)sVar5 >> 0x1f) << 0x20 | sVar5 & 0xffffffff) / 2;
          local_64 = (undefined4)lVar1;
          local_66 = (value_type_conflict5)lVar1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_66);
          local_68 = (short)local_64 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_68);
          local_6a = (short)local_64 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_6a);
          local_6c = (short)local_64 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_6c);
          local_6e = (short)local_64 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_6e);
          local_70 = (short)local_64 + 3;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&this->m_ndxBuf,&local_70);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_posBuf,(value_type_conflict3 *)&vtxNdx);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_posBuf,(value_type_conflict3 *)&x);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_posBuf,&local_60);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_posBuf,(value_type_conflict3 *)&x);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&this->m_posBuf,(value_type_conflict3 *)&vtxNdx);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_posBuf,&ax);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_posBuf,&local_60);
          std::vector<float,_std::allocator<float>_>::push_back(&this->m_posBuf,&ax);
        }
      }
    }
    fontXStart = fontXStart + 1;
  }
  return;
}

Assistant:

void DebugInfoRenderer::addTextToBuffer (const string& text, const int yOffset)
{
	static const char		characters[]	= "0123456789.:/";
	const int				numCharacters	= DE_LENGTH_OF_ARRAY(characters)-1; // \note -1 for null byte.
	const int				charWid			= 6;
	const int				charHei			= 6;
	static const string		charsStr		(characters);

	static const char font[numCharacters*charWid*charHei + 1]=
		" #### ""   #  "" #### ""##### ""   #  ""######"" #####""######"" #### "" #### ""      ""  ##  ""     #"
		"#    #""  ##  ""#    #""     #""  #   ""#     ""#     ""    # ""#    #""#    #""      ""  ##  ""    # "
		"#    #""   #  ""    # ""  ### "" #  # "" #### ""# ### ""   #  "" #### "" #####""      ""      ""   #  "
		"#    #""   #  ""   #  ""     #""######""     #""##   #""  #   ""#    #""     #""      ""  ##  ""  #   "
		"#    #""   #  ""  #   ""#    #""    # ""#    #""#    #"" #    ""#    #""   ## ""  ##  ""  ##  "" #    "
		" #### ""  ### ""######"" #### ""    # "" #### "" #### ""#     "" #### ""###   ""  ##  ""      ""#     ";

	for (int ndxInText = 0; ndxInText < (int)text.size(); ndxInText++)
	{
		const int ndxInCharset	= (int)charsStr.find(text[ndxInText]);
		DE_ASSERT(ndxInCharset < numCharacters);
		const int fontXStart	= ndxInCharset*charWid;

		for (int y = 0; y < charHei; y++)
		{
			float ay = -1.0f + (float)(y + 0 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			float by = -1.0f + (float)(y + 1 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			for (int x = 0; x < charWid; x++)
			{
				// \note Text is mirrored in x direction since on most(?) mobile devices the image is mirrored(?).
				float ax = 1.0f - (float)(x + 0 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);
				float bx = 1.0f - (float)(x + 1 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);

				if (font[y*numCharacters*charWid + fontXStart + x] != ' ')
				{
					const int vtxNdx = (int)m_posBuf.size()/2;

					m_ndxBuf.push_back(deUint16(vtxNdx+0));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+2));

					m_ndxBuf.push_back(deUint16(vtxNdx+2));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+3));

					m_posBuf.push_back(ax);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(ax);
					m_posBuf.push_back(by);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(by);
				}
			}
		}
	}
}